

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

bool __thiscall
TasGrid::GridLocalPolynomial::addParent<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  allocator_type local_51;
  Data2D<int> *local_50;
  vector<int,_std::allocator<int>_> dad;
  
  local_50 = destination;
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&dad,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_51);
  iVar3 = (point[direction] + 1) / 2 - (uint)(point[direction] < 4);
  dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [direction] = iVar3;
  if (iVar3 != -1) {
    bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)&dad);
    if (bVar1) {
      bVar1 = true;
      Data2D<int>::appendStrip(local_50,(vector<int,_std::allocator<int>_> *)&dad);
      goto LAB_001ad971;
    }
  }
  bVar1 = false;
LAB_001ad971:
  iVar3 = (uint)(point[direction] == 4) * 2 + -1;
  if (point[direction] == 3) {
    iVar3 = 2;
  }
  dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [direction] = iVar3;
  if (iVar3 != -1) {
    bVar2 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)&dad);
    if (bVar2) {
      bVar1 = true;
      Data2D<int>::appendStrip(local_50,(vector<int,_std::allocator<int>_> *)&dad);
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&dad);
  return bVar1;
}

Assistant:

bool GridLocalPolynomial::addParent(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> dad(point, point + num_dimensions);
    bool added = false;
    dad[direction] = RuleLocal::getParent<effrule>(point[direction]);
    if ((dad[direction] != -1) && exclude.missing(dad)){
        destination.appendStrip(dad);
        added = true;
    }
    dad[direction] = RuleLocal::getStepParent<effrule>(point[direction]);
    if ((dad[direction] != -1) && exclude.missing(dad)){
        destination.appendStrip(dad);
        added = true;
    }
    return added;
}